

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

void __thiscall
axl::sl::ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::release
          (ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *this)

{
  if (this->m_hdr != (Hdr *)0x0) {
    rc::RefCount::release(&this->m_hdr->super_RefCount);
  }
  this->m_p = (unsigned_long *)0x0;
  this->m_hdr = (Hdr *)0x0;
  this->m_count = 0;
  return;
}

Assistant:

void
	release() {
		if (m_hdr)
			m_hdr->release();

		initialize();
	}